

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerStep * triggerStepAllocate(Parse *pParse,u8 op,Token *pName,char *zStart,char *zEnd)

{
  sqlite3 *db_00;
  TriggerStep *pTVar1;
  TriggerStep *z_00;
  char *pcVar2;
  char *z;
  TriggerStep *pTriggerStep;
  sqlite3 *db;
  char *zEnd_local;
  char *zStart_local;
  Token *pName_local;
  u8 op_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pTVar1 = (TriggerStep *)sqlite3DbMallocZero(db_00,(ulong)pName->n + 0x59);
  if (pTVar1 != (TriggerStep *)0x0) {
    z_00 = pTVar1 + 1;
    memcpy(z_00,pName->z,(ulong)pName->n);
    sqlite3Dequote((char *)z_00);
    pTVar1->zTarget = (char *)z_00;
    pTVar1->op = op;
    pcVar2 = triggerSpanDup(db_00,zStart,zEnd);
    pTVar1->zSpan = pcVar2;
    if (1 < pParse->eParseMode) {
      sqlite3RenameTokenMap(pParse,pTVar1->zTarget,pName);
    }
  }
  return pTVar1;
}

Assistant:

static TriggerStep *triggerStepAllocate(
  Parse *pParse,              /* Parser context */
  u8 op,                      /* Trigger opcode */
  Token *pName,               /* The target name */
  const char *zStart,         /* Start of SQL text */
  const char *zEnd            /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep) + pName->n + 1);
  if( pTriggerStep ){
    char *z = (char*)&pTriggerStep[1];
    memcpy(z, pName->z, pName->n);
    sqlite3Dequote(z);
    pTriggerStep->zTarget = z;
    pTriggerStep->op = op;
    pTriggerStep->zSpan = triggerSpanDup(db, zStart, zEnd);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, pTriggerStep->zTarget, pName);
    }
  }
  return pTriggerStep;
}